

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.hpp
# Opt level: O2

void __thiscall tf::Runtime::schedule(Runtime *this,Task *task)

{
  Node *node;
  atomic<unsigned_long> *paVar1;
  
  node = task->_node;
  (node->_join_counter).super___atomic_base<unsigned_long>._M_i = 0;
  if (node->_parent == (Node *)0x0) {
    paVar1 = &node->_topology->_join_counter;
  }
  else {
    paVar1 = &node->_parent->_join_counter;
  }
  LOCK();
  (paVar1->super___atomic_base<unsigned_long>)._M_i =
       (paVar1->super___atomic_base<unsigned_long>)._M_i + 1;
  UNLOCK();
  Executor::_schedule(this->_executor,this->_worker,node);
  return;
}

Assistant:

inline void Runtime::schedule(Task task) {
  
  auto node = task._node;
  // need to keep the invariant: when scheduling a task, the task must have
  // zero dependency (join counter is 0)
  // or we can encounter bug when inserting a nested flow (e.g., module task)
  node->_join_counter.store(0, std::memory_order_relaxed);

  auto& j = node->_parent ? node->_parent->_join_counter :
                            node->_topology->_join_counter;
  j.fetch_add(1, std::memory_order_relaxed);
  _executor._schedule(_worker, node);
}